

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::vector<crnd::crn_unpacker::block_buffer_element>::resize
          (vector<crnd::crn_unpacker::block_buffer_element> *this,uint32 new_size)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint in_ESI;
  block_buffer_element *in_RDI;
  uint32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar3._0_2_ = in_RDI[1].endpoint_reference;
  uVar3._2_2_ = in_RDI[1].color_endpoint_index;
  if (uVar3 != in_ESI) {
    uVar1._0_2_ = in_RDI[1].endpoint_reference;
    uVar1._2_2_ = in_RDI[1].color_endpoint_index;
    if (in_ESI < uVar1) {
      scalar_type<crnd::crn_unpacker::block_buffer_element>::destruct_array
                (in_RDI,in_stack_ffffffffffffffdc);
    }
    else {
      uVar2._0_2_ = in_RDI[1].alpha0_endpoint_index;
      uVar2._2_2_ = in_RDI[1].alpha1_endpoint_index;
      if ((uVar2 < in_ESI) &&
         (bVar4 = increase_capacity((vector<crnd::crn_unpacker::block_buffer_element> *)
                                    CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (uint32)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)),
         !bVar4)) {
        return false;
      }
      scalar_type<crnd::crn_unpacker::block_buffer_element>::construct_array
                (in_RDI,in_stack_ffffffffffffffdc);
    }
    in_RDI[1].endpoint_reference = (short)in_ESI;
    in_RDI[1].color_endpoint_index = (short)(in_ESI >> 0x10);
  }
  return true;
}

Assistant:

inline bool resize(uint32 new_size) {
    if (m_size != new_size) {
      if (new_size < m_size)
        scalar_type<T>::destruct_array(m_p + new_size, m_size - new_size);
      else {
        if (new_size > m_capacity) {
          if (!increase_capacity(new_size, new_size == (m_size + 1)))
            return false;
        }

        scalar_type<T>::construct_array(m_p + m_size, new_size - m_size);
      }

      m_size = new_size;
    }

    return true;
  }